

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__4,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  local_58.piece_ = NullSafeStringView("Option field \"");
  local_88.piece_._M_str = (char *)**(undefined8 **)this;
  local_88.piece_._M_len = (*(undefined8 **)this)[1];
  local_b8.piece_ = NullSafeStringView("\" is not a field or extension of message \"");
  local_e8.piece_._M_len = (size_t)**(ushort **)(**(long **)(this + 8) + 0x10);
  local_e8.piece_._M_str =
       (char *)(~local_e8.piece_._M_len + (long)*(ushort **)(**(long **)(this + 8) + 0x10));
  local_118.piece_ = NullSafeStringView("\".");
  StrCat<>(__return_storage_ptr__,&local_58,&local_88,&local_b8,&local_e8,&local_118);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}